

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

void fs_print_error(string_view path,string_view fname)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR: Ffilesystem:",0x13);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,fname._M_str,fname._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,path._M_str,path._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")  ",3);
  fs_emit_error();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void fs_print_error(std::string_view path, std::string_view fname)
{

  std::cerr << "ERROR: Ffilesystem:" << fname << "(" << path << ")  ";

  fs_emit_error();

  std::cerr << std::endl;
}